

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt_converter.cpp
# Opt level: O0

uint32_t __thiscall
booster::locale::util::utf8_converter::to_unicode(utf8_converter *this,char **begin,char *end)

{
  char *pcVar1;
  char *in_RDX;
  char **in_RSI;
  code_point c;
  char *p;
  undefined4 local_4;
  
  pcVar1 = *in_RSI;
  local_4 = utf::utf_traits<char,1>::decode<char_const*>(in_RSI,in_RDX);
  if (local_4 == 0xffffffff) {
    local_4 = 0xffffffff;
  }
  else if (local_4 == 0xfffffffe) {
    local_4 = 0xfffffffe;
  }
  else {
    *in_RSI = pcVar1;
  }
  return local_4;
}

Assistant:

virtual uint32_t to_unicode(char const *&begin,char const *end)
        {
            char const *p=begin;
                        
            utf::code_point c = utf::utf_traits<char>::decode(p,end);

            if(c==utf::illegal)
                return illegal;

            if(c==utf::incomplete)
                return incomplete;

            begin = p;
            return c;
        }